

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  int iVar1;
  uchar *zRight;
  sqlite3_int64 sVar2;
  sqlite3_int64 iDel_00;
  char *pcVar3;
  i64 iNew_1;
  i64 iOld;
  i64 iNew;
  int eType1;
  i64 iDel;
  int eConflict;
  char *z;
  int rc;
  int eType0;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  sqlite_int64 *pRowid_local;
  sqlite3_value **apVal_local;
  sqlite3_vtab *psStack_10;
  int nArg_local;
  sqlite3_vtab *pVtab_local;
  
  _rc = pVtab[1].pModule;
  z._0_4_ = 0;
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  pConfig = (Fts5Config *)pVtab;
  pTab = (Fts5FullTable *)pRowid;
  pRowid_local = (sqlite_int64 *)apVal;
  apVal_local._4_4_ = nArg;
  psStack_10 = pVtab;
  fts5TripCursors((Fts5FullTable *)pVtab);
  z._4_4_ = sqlite3_value_type((sqlite3_value *)*pRowid_local);
  if ((z._4_4_ == 5) &&
     (iVar1 = sqlite3_value_type((sqlite3_value *)pRowid_local[*(int *)&_rc->xBestIndex + 2]),
     iVar1 != 5)) {
    zRight = sqlite3_value_text((sqlite3_value *)pRowid_local[*(int *)&_rc->xBestIndex + 2]);
    if ((*(int *)&_rc->xFilter == 0) ||
       (iVar1 = sqlite3_stricmp("delete",(char *)zRight), iVar1 != 0)) {
      z._0_4_ = fts5SpecialInsert((Fts5FullTable *)pConfig,(char *)zRight,
                                  (sqlite3_value *)pRowid_local[*(int *)&_rc->xBestIndex + 3]);
    }
    else {
      z._0_4_ = fts5SpecialDelete((Fts5FullTable *)pConfig,(sqlite3_value **)pRowid_local);
    }
  }
  else {
    iDel._4_4_ = 4;
    if (*(int *)&_rc->xFilter == 0) {
      iDel._4_4_ = sqlite3_vtab_on_conflict(*(sqlite3 **)_rc);
    }
    if ((z._4_4_ == 1) && (iVar1 = fts5IsContentless((Fts5FullTable *)pConfig), iVar1 != 0)) {
      pcVar3 = "DELETE from";
      if (1 < apVal_local._4_4_) {
        pcVar3 = "UPDATE";
      }
      pcVar3 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar3,_rc->xConnect);
      pConfig->zName = pcVar3;
      z._0_4_ = 1;
    }
    else if (apVal_local._4_4_ == 1) {
      sVar2 = sqlite3_value_int64((sqlite3_value *)*pRowid_local);
      z._0_4_ = sqlite3Fts5StorageDelete
                          ((Fts5Storage *)pConfig->abUnindexed,sVar2,(sqlite3_value **)0x0);
    }
    else {
      iVar1 = sqlite3_value_numeric_type((sqlite3_value *)pRowid_local[1]);
      if ((iVar1 == 1) || (iVar1 == 5)) {
        if (z._4_4_ == 1) {
          sVar2 = sqlite3_value_int64((sqlite3_value *)*pRowid_local);
          iDel_00 = sqlite3_value_int64((sqlite3_value *)pRowid_local[1]);
          if ((iVar1 == 1) && (sVar2 != iDel_00)) {
            if (iDel._4_4_ == 5) {
              z._0_4_ = sqlite3Fts5StorageDelete
                                  ((Fts5Storage *)pConfig->abUnindexed,sVar2,(sqlite3_value **)0x0);
              if ((int)z == 0) {
                z._0_4_ = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)pConfig->abUnindexed,iDel_00,
                                     (sqlite3_value **)0x0);
              }
              fts5StorageInsert((int *)&z,(Fts5FullTable *)pConfig,(sqlite3_value **)pRowid_local,
                                (i64 *)pTab);
            }
            else {
              z._0_4_ = sqlite3Fts5StorageContentInsert
                                  ((Fts5Storage *)pConfig->abUnindexed,
                                   (sqlite3_value **)pRowid_local,(i64 *)pTab);
              if ((int)z == 0) {
                z._0_4_ = sqlite3Fts5StorageDelete
                                    ((Fts5Storage *)pConfig->abUnindexed,sVar2,(sqlite3_value **)0x0
                                    );
              }
              if ((int)z == 0) {
                z._0_4_ = sqlite3Fts5StorageIndexInsert
                                    ((Fts5Storage *)pConfig->abUnindexed,
                                     (sqlite3_value **)pRowid_local,(i64)(pTab->p).base.pModule);
              }
            }
          }
          else {
            z._0_4_ = sqlite3Fts5StorageDelete
                                ((Fts5Storage *)pConfig->abUnindexed,sVar2,(sqlite3_value **)0x0);
            fts5StorageInsert((int *)&z,(Fts5FullTable *)pConfig,(sqlite3_value **)pRowid_local,
                              (i64 *)pTab);
          }
        }
        else {
          if ((iDel._4_4_ == 5) && (iVar1 == 1)) {
            sVar2 = sqlite3_value_int64((sqlite3_value *)pRowid_local[1]);
            z._0_4_ = sqlite3Fts5StorageDelete
                                ((Fts5Storage *)pConfig->abUnindexed,sVar2,(sqlite3_value **)0x0);
          }
          fts5StorageInsert((int *)&z,(Fts5FullTable *)pConfig,(sqlite3_value **)pRowid_local,
                            (i64 *)pTab);
        }
      }
      else {
        z._0_4_ = 0x14;
      }
    }
  }
  *(undefined8 *)(*(long *)&pConfig->nCol + 0xa0) = 0;
  return (int)z;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}